

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O0

void run_bitset_container_lazy_union
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  uint uVar1;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  int *in_RDI;
  rle16_t rle;
  int32_t rlepos;
  bitset_container_t *in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe2;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  
  if (in_RSI != in_RDX) {
    bitset_container_copy
              ((bitset_container_t *)
               CONCAT44(in_stack_ffffffffffffffe4,
                        CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)),
               in_stack_ffffffffffffffd8);
  }
  for (iVar2 = 0; iVar2 < *in_RDI; iVar2 = iVar2 + 1) {
    uVar1 = *(uint *)(*(long *)(in_RDI + 2) + (long)iVar2 * 4);
    bitset_set_lenrange(*(uint64_t **)(in_RDX + 2),uVar1 & 0xffff,uVar1 >> 0x10);
  }
  *in_RDX = 0xffffffff;
  return;
}

Assistant:

void run_bitset_container_lazy_union(const run_container_t *src_1,
                                     const bitset_container_t *src_2,
                                     bitset_container_t *dst) {
    assert(!run_container_is_full(src_1));  // catch this case upstream
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_set_lenrange(dst->words, rle.value, rle.length);
    }
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}